

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  cTValue *pcVar6;
  cTValue *o2_00;
  TValue *pTVar7;
  code *cont;
  MMS mm;
  
  uVar1 = (o1->field_2).it;
  pcVar6 = o1;
  if ((uVar1 == 0xfffffff5) || (uVar2 = (o2->field_2).it, pcVar6 = o2, uVar2 == 0xfffffff5)) {
    pcVar6 = lj_meta_lookup(L,pcVar6,MM_le - ((op & 2U) == 0));
    if ((pcVar6->field_2).it != 0xffffffff) {
      cont = lj_cont_condf;
      if ((op & 1U) == 0) {
        cont = lj_cont_condt;
      }
LAB_00110b9b:
      pTVar7 = mmcall(L,cont,pcVar6,o1,o2);
      return pTVar7;
    }
  }
  else {
    pcVar6 = o1;
    if (uVar1 == uVar2) {
      if (uVar1 == 0xfffffffb) {
        uVar3 = lj_str_cmp((GCstr *)(ulong)(o1->u32).lo,(GCstr *)(ulong)(o2->u32).lo);
        uVar4 = uVar3 >> 0x1f;
        if ((op & 2U) != 0) {
          uVar4 = (uint)((int)uVar3 < 1);
        }
        return (TValue *)(ulong)(uVar4 ^ op & 1U);
      }
    }
    else if (1 < (uVar2 + 3 | uVar1 + 3)) goto LAB_00110bb1;
    while( true ) {
      o1 = pcVar6;
      mm = MM_le - ((op & 2U) == 0);
      pcVar6 = lj_meta_lookup(L,o1,mm);
      o2_00 = lj_meta_lookup(L,o2,mm);
      if (((pcVar6->field_2).it != 0xffffffff) && (iVar5 = lj_obj_equal(pcVar6,o2_00), iVar5 != 0))
      {
        cont = lj_cont_condf;
        if ((op & 1U) == 0) {
          cont = lj_cont_condt;
        }
        goto LAB_00110b9b;
      }
      if ((op & 2U) == 0) break;
      op = op ^ 3;
      pcVar6 = o2;
      o2 = o1;
    }
  }
LAB_00110bb1:
  lj_err_comp(L,o1,o2);
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}